

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetProcAddressExtensionCase::executeTest(GetProcAddressExtensionCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  TestLog *pTVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  deUint32 err;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  __eglMustCastToProperFunctionPointerType p_Var6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long local_1c8;
  undefined1 local_1b0 [384];
  
  pTVar2 = ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  pbVar3 = (this->super_GetProcAddressCase).m_supported.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->super_GetProcAddressCase).m_supported.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,pbVar3,&this->m_extName);
  lVar10 = 0x10;
  do {
    iVar4 = std::__cxx11::string::compare((char *)&this->m_extName);
    if (iVar4 == 0) {
      uVar9 = *(uint *)(&UNK_003ef5b8 + lVar10);
      local_1c8 = *(long *)((long)&(anonymous_namespace)::s_extensions + lVar10);
      goto LAB_00231f9f;
    }
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0xee0);
  uVar9 = 0;
  local_1c8 = 0;
LAB_00231f9f:
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(this->m_extName)._M_dataplus._M_p,(this->m_extName)._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
  pcVar8 = "not supported";
  if (_Var5._M_current != pbVar3) {
    pcVar8 = "supported";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,pcVar8,(ulong)(_Var5._M_current == pbVar3) * 4 + 9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  if (0 < (int)uVar9) {
    this_00 = &(this->super_GetProcAddressCase).super_CallLogWrapper;
    uVar11 = 0;
    do {
      pcVar8 = *(char **)(local_1c8 + uVar11 * 8);
      p_Var6 = eglu::CallLogWrapper::eglGetProcAddress(this_00,pcVar8);
      err = eglu::CallLogWrapper::eglGetError(this_00);
      eglu::checkError(err,"eglGetProcAddress()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetProcAddressTests.cpp"
                       ,0xcc);
      if ((_Var5._M_current != pbVar3) && (p_Var6 == (__eglMustCastToProperFunctionPointerType)0x0))
      {
        local_1b0._0_8_ = pTVar2;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Fail, received null pointer for supported extension function: ",0x3e);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
        }
        else {
          sVar7 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar8,sVar7);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        tcu::TestContext::setTestResult
                  ((this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Unexpected null pointer");
      }
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  return;
}

Assistant:

void executeTest (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		bool					supported	= isSupported(m_extName);
		const FunctionNames		funcNames	= getExtFunctionNames(m_extName);

		DE_ASSERT(funcNames.numFunctions > 0);

		log << TestLog::Message << m_extName << ": " << (supported ? "supported" : "not supported") << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		for (int funcNdx = 0; funcNdx < funcNames.numFunctions; funcNdx++)
		{
			const char*	funcName		= funcNames.functions[funcNdx];
			void		(*funcPtr)(void);

			funcPtr = eglGetProcAddress(funcName);
			eglu::checkError(eglGetError(), "eglGetProcAddress()", __FILE__, __LINE__);

			if (supported && funcPtr == 0)
			{
				log << TestLog::Message << "Fail, received null pointer for supported extension function: " << funcName << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Unexpected null pointer");
			}
		}
	}